

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

string * utilities::trim(string *__return_storage_ptr__,string *s)

{
  string local_30;
  
  ltrim(&local_30,s);
  rtrim(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string trim(const std::string& s)
    {
        return rtrim(ltrim(s));
    }